

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

void ncnn::pack_B_tile(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int kk_25;
  float *p0_13;
  __m128 _tmp1_4;
  __m128 _tmp0_4;
  __m128 _r1_7;
  __m128 _r0_7;
  __m256 _r1_6;
  __m256 _r0_6;
  int kk_24;
  float *p1_9;
  float *p0_12;
  __m128 tmp0_5;
  __m128 tmp1_5;
  __m128 tmp2_5;
  __m128 tmp3_5;
  __m128 _r3_5;
  __m128 _r2_5;
  __m128 _r1_5;
  __m128 _r0_5;
  __m256 _r3_4;
  __m256 _r2_4;
  __m256 _r1_4;
  __m256 _r0_4;
  int kk_23;
  float *p3_2;
  float *p2_3;
  float *p1_8;
  float *p0_11;
  int kk_22;
  float *p0_10;
  int kk_21;
  int kk_20;
  float *p0_9;
  int kk_19;
  int kk_18;
  int kk_17;
  int kk_16;
  float *p0_8;
  __m128 tmp0_4;
  __m128 tmp1_4;
  __m128 tmp2_4;
  __m128 tmp3_4;
  __m128 tmp0_3;
  __m128 tmp1_3;
  __m128 tmp2_3;
  __m128 tmp3_3;
  __m128 _r7_3;
  __m128 _r6_3;
  __m128 _r5_3;
  __m128 _r4_3;
  __m128 _r3_3;
  __m128 _r2_3;
  __m128 _r1_3;
  __m128 _r0_3;
  __m256 _r7_2;
  __m256 _r6_2;
  __m256 _r5_2;
  __m256 _r4_2;
  __m256 _r3_2;
  __m256 _r2_2;
  __m256 _r1_2;
  __m256 _r0_2;
  int kk_15;
  float *p7_1;
  float *p6_1;
  float *p5_1;
  float *p4_1;
  float *p3_1;
  float *p2_2;
  float *p1_7;
  float *p0_7;
  int kk_14;
  float *p1_6;
  float *p0_6;
  int kk_13;
  int kk_12;
  float *p1_5;
  float *p0_5;
  int kk_11;
  int kk_10;
  int kk_9;
  int kk_8;
  float *p1_4;
  float *p0_4;
  __m128 tmp0_2;
  __m128 tmp1_2;
  __m128 tmp2_2;
  __m128 tmp3_2;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _rb_1;
  __m128 _ra_1;
  __m128 _r9_1;
  __m128 _r8_1;
  __m128 _r7_1;
  __m128 _r6_1;
  __m128 _r5_1;
  __m128 _r4_1;
  __m128 _r3_1;
  __m128 _r2_1;
  __m128 _r1_1;
  __m128 _r0_1;
  __m256 _rb;
  __m256 _ra;
  __m256 _r9;
  __m256 _r8;
  __m256 _r7;
  __m256 _r6;
  __m256 _r5;
  __m256 _r4;
  __m256 _r3;
  __m256 _r2;
  __m256 _r1;
  __m256 _r0;
  int kk_7;
  float *pb;
  float *pa;
  float *p9;
  float *p8;
  float *p7;
  float *p6;
  float *p5;
  float *p4;
  float *p3;
  float *p2_1;
  float *p1_3;
  float *p0_3;
  int kk_6;
  float *p2;
  float *p1_2;
  float *p0_2;
  int kk_5;
  int kk_4;
  float *p1_1;
  float *p0_1;
  int kk_3;
  int kk_2;
  int kk_1;
  int kk;
  float *p1;
  float *p0;
  int jj;
  float *pp;
  int B_hstep;
  int elempack;
  __m256 _tmpf_1;
  __m256 _tmpe_1;
  __m256 _tmpd_1;
  __m256 _tmpc_1;
  __m256 _tmpb_1;
  __m256 _tmpa_1;
  __m256 _tmp9_1;
  __m256 _tmp8_1;
  __m256 _tmp7_1;
  __m256 _tmp6_1;
  __m256 _tmp5_1;
  __m256 _tmp4_1;
  __m256 _tmp3_1;
  __m256 _tmp2_1;
  __m256 _tmp1_1;
  __m256 _tmp0_1;
  __m256 _tmp7_2;
  __m256 _tmp6_2;
  __m256 _tmp5_2;
  __m256 _tmp4_2;
  __m256 _tmp3_2;
  __m256 _tmp2_2;
  __m256 _tmp1_2;
  __m256 _tmp0_2;
  __m256 _tmp1_3;
  __m256 _tmp0_3;
  __m256 _tmpn;
  __m256 _tmpm;
  __m256 _tmpl;
  __m256 _tmpk;
  __m256 _tmpj;
  __m256 _tmpi;
  __m256 _tmph;
  __m256 _tmpg;
  __m256 _tmpf;
  __m256 _tmpe;
  __m256 _tmpd;
  __m256 _tmpc;
  __m256 _tmpb;
  __m256 _tmpa;
  __m256 _tmp9;
  __m256 _tmp8;
  __m256 _tmp7;
  __m256 _tmp6;
  __m256 _tmp5;
  __m256 _tmp4;
  __m256 _tmp3;
  __m256 _tmp2;
  __m256 _tmp1;
  __m256 _tmp0;
  int local_3070;
  int local_306c;
  undefined1 (*local_3068) [32];
  undefined8 local_3050;
  undefined8 uStack_3048;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  int local_2fd4;
  undefined1 (*local_2fd0) [32];
  undefined1 (*local_2fc8) [32];
  undefined8 local_2f70;
  undefined8 uStack_2f68;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 local_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  int local_2ebc;
  undefined1 (*local_2eb8) [32];
  undefined1 (*local_2eb0) [32];
  undefined1 (*local_2ea8) [32];
  undefined1 (*local_2ea0) [32];
  int local_2e94;
  undefined1 (*local_2e90) [16];
  int local_2e88;
  int local_2e84;
  undefined1 (*local_2e80) [16];
  int local_2e78;
  int local_2e74;
  int local_2e70;
  int local_2e6c;
  undefined1 (*local_2e68) [16];
  undefined8 local_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 local_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 local_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 local_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  int local_2c54;
  undefined1 (*local_2c50) [32];
  undefined1 (*local_2c48) [32];
  undefined1 (*local_2c40) [32];
  undefined1 (*local_2c38) [32];
  undefined1 (*local_2c30) [32];
  undefined1 (*local_2c28) [32];
  undefined1 (*local_2c20) [32];
  undefined1 (*local_2c18) [32];
  int local_2c0c;
  undefined1 (*local_2c08) [16];
  undefined8 *local_2c00;
  int local_2bf8;
  int local_2bf4;
  undefined1 (*local_2bf0) [16];
  undefined1 (*local_2be8) [32];
  int local_2be0;
  int local_2bdc;
  int local_2bd8;
  int local_2bd4;
  undefined1 (*local_2bd0) [16];
  undefined1 (*local_2bc8) [32];
  undefined8 local_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 local_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 local_2ab0;
  undefined8 uStack_2aa8;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 local_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 local_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 local_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  int local_28a4;
  undefined1 (*local_28a0) [32];
  undefined1 (*local_2898) [32];
  undefined1 (*local_2890) [32];
  undefined1 (*local_2888) [32];
  undefined1 (*local_2880) [32];
  undefined1 (*local_2878) [32];
  undefined1 (*local_2870) [32];
  undefined1 (*local_2868) [32];
  undefined1 (*local_2860) [32];
  undefined1 (*local_2858) [32];
  undefined1 (*local_2850) [32];
  undefined1 (*local_2848) [32];
  int local_283c;
  undefined1 (*local_2838) [16];
  undefined8 *local_2830;
  undefined8 *local_2828;
  int local_2820;
  int local_281c;
  undefined1 (*local_2818) [32];
  undefined8 *local_2810;
  int local_2808;
  int local_2804;
  int local_2800;
  int local_27fc;
  undefined1 (*local_27f8) [32];
  undefined8 *local_27f0;
  int local_27e4;
  undefined1 (*local_27e0) [32];
  
  iVar1 = (int)in_RDI[3];
  if ((int)in_RDI[5] == 3) {
    local_3070 = (int)in_RDI[8];
  }
  else {
    local_3070 = *(int *)((long)in_RDI + 0x2c);
  }
  local_27e0 = (undefined1 (*) [32])*in_RSI;
  for (local_27e4 = 0; local_27e4 + 0xb < in_ECX; local_27e4 = local_27e4 + 0xc) {
    if (iVar1 == 0x10) {
      local_27f0 = (undefined8 *)
                   (*in_RDI + (long)(((in_EDX + local_27e4) / 0x10) * 0x10 * local_3070) * 4 +
                   (long)(in_R8D << 4) * 4);
      local_27f8 = (undefined1 (*) [32])
                   (*in_RDI + (long)((((in_EDX + local_27e4) / 0x10) * 0x10 + 0x10) * local_3070) *
                              4 + (long)(in_R8D << 4) * 4);
      if ((in_EDX + local_27e4) % 0x10 == 0) {
        for (local_27fc = 0; local_27fc < in_R9D; local_27fc = local_27fc + 1) {
          uVar29 = local_27f0[1];
          uVar30 = local_27f0[2];
          uVar31 = local_27f0[3];
          *(undefined8 *)*local_27e0 = *local_27f0;
          *(undefined8 *)(*local_27e0 + 8) = uVar29;
          *(undefined8 *)(*local_27e0 + 0x10) = uVar30;
          *(undefined8 *)(*local_27e0 + 0x18) = uVar31;
          *(undefined1 (*) [16])local_27e0[1] = *(undefined1 (*) [16])(local_27f0 + 4);
          local_27e0 = (undefined1 (*) [32])(local_27e0[1] + 0x10);
          local_27f0 = local_27f0 + 8;
        }
      }
      if ((in_EDX + local_27e4) % 0x10 == 4) {
        for (local_2800 = 0; local_2800 < in_R9D; local_2800 = local_2800 + 1) {
          uVar29 = local_27f0[3];
          uVar30 = local_27f0[4];
          uVar31 = local_27f0[5];
          *(undefined8 *)*local_27e0 = local_27f0[2];
          *(undefined8 *)(*local_27e0 + 8) = uVar29;
          *(undefined8 *)(*local_27e0 + 0x10) = uVar30;
          *(undefined8 *)(*local_27e0 + 0x18) = uVar31;
          *(undefined1 (*) [16])local_27e0[1] = *(undefined1 (*) [16])(local_27f0 + 6);
          local_27e0 = (undefined1 (*) [32])(local_27e0[1] + 0x10);
          local_27f0 = local_27f0 + 8;
        }
      }
      if ((in_EDX + local_27e4) % 0x10 == 8) {
        for (local_2804 = 0; local_2804 < in_R9D; local_2804 = local_2804 + 1) {
          uVar29 = local_27f0[5];
          uVar30 = local_27f0[6];
          uVar31 = local_27f0[7];
          *(undefined8 *)*local_27e0 = local_27f0[4];
          *(undefined8 *)(*local_27e0 + 8) = uVar29;
          *(undefined8 *)(*local_27e0 + 0x10) = uVar30;
          *(undefined8 *)(*local_27e0 + 0x18) = uVar31;
          *(undefined1 (*) [16])local_27e0[1] = *(undefined1 (*) [16])*local_27f8;
          local_27e0 = (undefined1 (*) [32])(local_27e0[1] + 0x10);
          local_27f0 = local_27f0 + 8;
          local_27f8 = local_27f8 + 2;
        }
      }
      if ((in_EDX + local_27e4) % 0x10 == 0xc) {
        for (local_2808 = 0; local_2808 < in_R9D; local_2808 = local_2808 + 1) {
          uVar29 = local_27f0[7];
          *(undefined8 *)*local_27e0 = local_27f0[6];
          *(undefined8 *)(*local_27e0 + 8) = uVar29;
          *(undefined1 (*) [32])(*local_27e0 + 0x10) = *local_27f8;
          local_27e0 = (undefined1 (*) [32])(local_27e0[1] + 0x10);
          local_27f0 = local_27f0 + 8;
          local_27f8 = local_27f8 + 2;
        }
      }
    }
    if (iVar1 == 8) {
      local_2810 = (undefined8 *)
                   (*in_RDI + (long)(((in_EDX + local_27e4) / 8) * 8 * local_3070) * 4 +
                   (long)(in_R8D << 3) * 4);
      local_2818 = (undefined1 (*) [32])
                   (*in_RDI + (long)((((in_EDX + local_27e4) / 8) * 8 + 8) * local_3070) * 4 +
                   (long)(in_R8D << 3) * 4);
      if ((in_EDX + local_27e4) % 8 == 0) {
        for (local_281c = 0; local_281c < in_R9D; local_281c = local_281c + 1) {
          uVar29 = local_2810[1];
          uVar30 = local_2810[2];
          uVar31 = local_2810[3];
          *(undefined8 *)*local_27e0 = *local_2810;
          *(undefined8 *)(*local_27e0 + 8) = uVar29;
          *(undefined8 *)(*local_27e0 + 0x10) = uVar30;
          *(undefined8 *)(*local_27e0 + 0x18) = uVar31;
          *(undefined1 (*) [16])local_27e0[1] = *(undefined1 (*) [16])*local_2818;
          local_27e0 = (undefined1 (*) [32])(local_27e0[1] + 0x10);
          local_2810 = local_2810 + 4;
          local_2818 = local_2818 + 1;
        }
      }
      if ((in_EDX + local_27e4) % 8 == 4) {
        for (local_2820 = 0; local_2820 < in_R9D; local_2820 = local_2820 + 1) {
          uVar29 = local_2810[3];
          *(undefined8 *)*local_27e0 = local_2810[2];
          *(undefined8 *)(*local_27e0 + 8) = uVar29;
          *(undefined1 (*) [32])(*local_27e0 + 0x10) = *local_2818;
          local_27e0 = (undefined1 (*) [32])(local_27e0[1] + 0x10);
          local_2810 = local_2810 + 4;
          local_2818 = local_2818 + 1;
        }
      }
    }
    if (iVar1 == 4) {
      local_2828 = (undefined8 *)
                   (*in_RDI + (long)((in_EDX + local_27e4) * local_3070) * 4 +
                   (long)(in_R8D << 2) * 4);
      local_2830 = (undefined8 *)
                   (*in_RDI + (long)((in_EDX + local_27e4 + 4) * local_3070) * 4 +
                   (long)(in_R8D << 2) * 4);
      local_2838 = (undefined1 (*) [16])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 8) * local_3070) * 4 +
                   (long)(in_R8D << 2) * 4);
      for (local_283c = 0; local_283c < in_R9D; local_283c = local_283c + 1) {
        uVar29 = local_2828[1];
        *(undefined8 *)*local_27e0 = *local_2828;
        *(undefined8 *)(*local_27e0 + 8) = uVar29;
        uVar29 = local_2830[1];
        *(undefined8 *)(*local_27e0 + 0x10) = *local_2830;
        *(undefined8 *)(*local_27e0 + 0x18) = uVar29;
        *(undefined1 (*) [16])local_27e0[1] = *local_2838;
        local_27e0 = (undefined1 (*) [32])(local_27e0[1] + 0x10);
        local_2828 = local_2828 + 2;
        local_2830 = local_2830 + 2;
        local_2838 = local_2838 + 1;
      }
    }
    if (iVar1 == 1) {
      local_2848 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4) * local_3070) * 4 + (long)in_R8D * 4);
      local_2850 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 1) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2858 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 2) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2860 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 3) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2868 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 4) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2870 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 5) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2878 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 6) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2880 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 7) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2888 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 8) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2890 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 9) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2898 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 10) * local_3070) * 4 + (long)in_R8D * 4
                   );
      local_28a0 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 0xb) * local_3070) * 4 +
                   (long)in_R8D * 4);
      for (local_28a4 = 0; local_28a4 + 7 < in_R9D; local_28a4 = local_28a4 + 8) {
        auVar23 = vunpcklps_avx(*local_2848,*local_2850);
        auVar6 = vunpckhps_avx(*local_2848,*local_2850);
        auVar24 = vunpcklps_avx(*local_2858,*local_2860);
        auVar7 = vunpckhps_avx(*local_2858,*local_2860);
        auVar25 = vunpcklps_avx(*local_2868,*local_2870);
        auVar8 = vunpckhps_avx(*local_2868,*local_2870);
        auVar26 = vunpcklps_avx(*local_2878,*local_2880);
        auVar9 = vunpckhps_avx(*local_2878,*local_2880);
        auVar27 = vunpcklps_avx(*local_2888,*local_2890);
        auVar10 = vunpckhps_avx(*local_2888,*local_2890);
        auVar28 = vunpcklps_avx(*local_2898,*local_28a0);
        auVar11 = vunpckhps_avx(*local_2898,*local_28a0);
        auVar17 = vunpcklpd_avx(auVar23,auVar24);
        auVar23 = vunpckhpd_avx(auVar23,auVar24);
        auVar24 = vunpcklpd_avx(auVar6,auVar7);
        auVar6 = vunpckhpd_avx(auVar6,auVar7);
        auVar18 = vunpcklpd_avx(auVar25,auVar26);
        auVar7 = vunpckhpd_avx(auVar25,auVar26);
        auVar25 = vunpcklpd_avx(auVar8,auVar9);
        auVar8 = vunpckhpd_avx(auVar8,auVar9);
        auVar26 = vunpcklpd_avx(auVar27,auVar28);
        auVar9 = vunpckhpd_avx(auVar27,auVar28);
        auVar27 = vunpcklpd_avx(auVar10,auVar11);
        auVar10 = vunpckhpd_avx(auVar10,auVar11);
        auVar11 = vperm2f128_avx(auVar17,auVar18,0x20);
        auVar28 = vperm2f128_avx(auVar26,auVar23,0x20);
        uStack_28e8 = auVar28._24_8_;
        uStack_28f0 = auVar28._16_8_;
        uStack_28f8 = auVar28._8_8_;
        local_2900 = auVar28._0_8_;
        auVar28 = vperm2f128_avx(auVar7,auVar9,0x20);
        uStack_2908 = auVar28._24_8_;
        uStack_2910 = auVar28._16_8_;
        uStack_2918 = auVar28._8_8_;
        local_2920 = auVar28._0_8_;
        auVar28 = vperm2f128_avx(auVar24,auVar25,0x20);
        uStack_2928 = auVar28._24_8_;
        uStack_2930 = auVar28._16_8_;
        uStack_2938 = auVar28._8_8_;
        local_2940 = auVar28._0_8_;
        auVar28 = vperm2f128_avx(auVar27,auVar6,0x20);
        uStack_2948 = auVar28._24_8_;
        uStack_2950 = auVar28._16_8_;
        uStack_2958 = auVar28._8_8_;
        local_2960 = auVar28._0_8_;
        auVar28 = vperm2f128_avx(auVar8,auVar10,0x20);
        uStack_2968 = auVar28._24_8_;
        uStack_2970 = auVar28._16_8_;
        uStack_2978 = auVar28._8_8_;
        local_2980 = auVar28._0_8_;
        auVar17 = vperm2f128_avx(auVar17,auVar18,0x31);
        uStack_2988 = auVar17._24_8_;
        uStack_2990 = auVar17._16_8_;
        uStack_2998 = auVar17._8_8_;
        local_29a0 = auVar17._0_8_;
        auVar23 = vperm2f128_avx(auVar26,auVar23,0x31);
        uStack_29a8 = auVar23._24_8_;
        uStack_29b0 = auVar23._16_8_;
        uStack_29b8 = auVar23._8_8_;
        local_29c0 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar7,auVar9,0x31);
        uStack_29c8 = auVar23._24_8_;
        uStack_29d0 = auVar23._16_8_;
        uStack_29d8 = auVar23._8_8_;
        local_29e0 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar24,auVar25,0x31);
        uStack_29e8 = auVar23._24_8_;
        uStack_29f0 = auVar23._16_8_;
        uStack_29f8 = auVar23._8_8_;
        local_2a00 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar27,auVar6,0x31);
        uStack_2a08 = auVar23._24_8_;
        uStack_2a10 = auVar23._16_8_;
        uStack_2a18 = auVar23._8_8_;
        local_2a20 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar8,auVar10,0x31);
        uStack_28c8 = auVar11._24_8_;
        uStack_28d0 = auVar11._16_8_;
        uStack_28d8 = auVar11._8_8_;
        local_28e0 = auVar11._0_8_;
        *(undefined8 *)*local_27e0 = local_28e0;
        *(undefined8 *)(*local_27e0 + 8) = uStack_28d8;
        *(undefined8 *)(*local_27e0 + 0x10) = uStack_28d0;
        *(undefined8 *)(*local_27e0 + 0x18) = uStack_28c8;
        *(undefined8 *)local_27e0[1] = local_2900;
        *(undefined8 *)(local_27e0[1] + 8) = uStack_28f8;
        *(undefined8 *)(local_27e0[1] + 0x10) = uStack_28f0;
        *(undefined8 *)(local_27e0[1] + 0x18) = uStack_28e8;
        *(undefined8 *)local_27e0[2] = local_2920;
        *(undefined8 *)(local_27e0[2] + 8) = uStack_2918;
        *(undefined8 *)(local_27e0[2] + 0x10) = uStack_2910;
        *(undefined8 *)(local_27e0[2] + 0x18) = uStack_2908;
        *(undefined8 *)local_27e0[3] = local_2940;
        *(undefined8 *)(local_27e0[3] + 8) = uStack_2938;
        *(undefined8 *)(local_27e0[3] + 0x10) = uStack_2930;
        *(undefined8 *)(local_27e0[3] + 0x18) = uStack_2928;
        *(undefined8 *)local_27e0[4] = local_2960;
        *(undefined8 *)(local_27e0[4] + 8) = uStack_2958;
        *(undefined8 *)(local_27e0[4] + 0x10) = uStack_2950;
        *(undefined8 *)(local_27e0[4] + 0x18) = uStack_2948;
        *(undefined8 *)local_27e0[5] = local_2980;
        *(undefined8 *)(local_27e0[5] + 8) = uStack_2978;
        *(undefined8 *)(local_27e0[5] + 0x10) = uStack_2970;
        *(undefined8 *)(local_27e0[5] + 0x18) = uStack_2968;
        *(undefined8 *)local_27e0[6] = local_29a0;
        *(undefined8 *)(local_27e0[6] + 8) = uStack_2998;
        *(undefined8 *)(local_27e0[6] + 0x10) = uStack_2990;
        *(undefined8 *)(local_27e0[6] + 0x18) = uStack_2988;
        *(undefined8 *)local_27e0[7] = local_29c0;
        *(undefined8 *)(local_27e0[7] + 8) = uStack_29b8;
        *(undefined8 *)(local_27e0[7] + 0x10) = uStack_29b0;
        *(undefined8 *)(local_27e0[7] + 0x18) = uStack_29a8;
        *(undefined8 *)local_27e0[8] = local_29e0;
        *(undefined8 *)(local_27e0[8] + 8) = uStack_29d8;
        *(undefined8 *)(local_27e0[8] + 0x10) = uStack_29d0;
        *(undefined8 *)(local_27e0[8] + 0x18) = uStack_29c8;
        *(undefined8 *)local_27e0[9] = local_2a00;
        *(undefined8 *)(local_27e0[9] + 8) = uStack_29f8;
        *(undefined8 *)(local_27e0[9] + 0x10) = uStack_29f0;
        *(undefined8 *)(local_27e0[9] + 0x18) = uStack_29e8;
        *(undefined8 *)local_27e0[10] = local_2a20;
        *(undefined8 *)(local_27e0[10] + 8) = uStack_2a18;
        *(undefined8 *)(local_27e0[10] + 0x10) = uStack_2a10;
        *(undefined8 *)(local_27e0[10] + 0x18) = uStack_2a08;
        local_27e0[0xb] = auVar23;
        local_27e0 = local_27e0 + 0xc;
        local_2848 = local_2848 + 1;
        local_2850 = local_2850 + 1;
        local_2858 = local_2858 + 1;
        local_2860 = local_2860 + 1;
        local_2868 = local_2868 + 1;
        local_2870 = local_2870 + 1;
        local_2878 = local_2878 + 1;
        local_2880 = local_2880 + 1;
        local_2888 = local_2888 + 1;
        local_2890 = local_2890 + 1;
        local_2898 = local_2898 + 1;
        local_28a0 = local_28a0 + 1;
      }
      for (; local_28a4 + 3 < in_R9D; local_28a4 = local_28a4 + 4) {
        auVar19 = vunpcklps_avx(*(undefined1 (*) [16])*local_2848,*(undefined1 (*) [16])*local_2850)
        ;
        auVar20 = vunpcklps_avx(*(undefined1 (*) [16])*local_2858,*(undefined1 (*) [16])*local_2860)
        ;
        auVar2 = vunpckhps_avx(*(undefined1 (*) [16])*local_2848,*(undefined1 (*) [16])*local_2850);
        auVar3 = vunpckhps_avx(*(undefined1 (*) [16])*local_2858,*(undefined1 (*) [16])*local_2860);
        auVar12 = vunpcklpd_avx(auVar19,auVar20);
        auVar19 = vunpckhpd_avx(auVar19,auVar20);
        auVar13 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        auVar3 = vunpcklps_avx(*(undefined1 (*) [16])*local_2868,*(undefined1 (*) [16])*local_2870);
        auVar21 = vunpcklps_avx(*(undefined1 (*) [16])*local_2878,*(undefined1 (*) [16])*local_2880)
        ;
        auVar20 = vunpckhps_avx(*(undefined1 (*) [16])*local_2868,*(undefined1 (*) [16])*local_2870)
        ;
        auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*local_2878,*(undefined1 (*) [16])*local_2880);
        auVar14 = vunpcklpd_avx(auVar3,auVar21);
        auVar3 = vunpckhpd_avx(auVar3,auVar21);
        auVar15 = vunpcklpd_avx(auVar20,auVar4);
        auVar20 = vunpckhpd_avx(auVar20,auVar4);
        auVar4 = vunpcklps_avx(*(undefined1 (*) [16])*local_2888,*(undefined1 (*) [16])*local_2890);
        auVar22 = vunpcklps_avx(*(undefined1 (*) [16])*local_2898,*(undefined1 (*) [16])*local_28a0)
        ;
        auVar21 = vunpckhps_avx(*(undefined1 (*) [16])*local_2888,*(undefined1 (*) [16])*local_2890)
        ;
        auVar5 = vunpckhps_avx(*(undefined1 (*) [16])*local_2898,*(undefined1 (*) [16])*local_28a0);
        auVar16 = vunpcklpd_avx(auVar4,auVar22);
        auVar4 = vunpckhpd_avx(auVar4,auVar22);
        auVar22 = vunpcklpd_avx(auVar21,auVar5);
        auVar21 = vunpckhpd_avx(auVar21,auVar5);
        local_2a50 = auVar12._0_8_;
        uStack_2a48 = auVar12._8_8_;
        *(undefined8 *)*local_27e0 = local_2a50;
        *(undefined8 *)(*local_27e0 + 8) = uStack_2a48;
        local_2a90 = auVar14._0_8_;
        uStack_2a88 = auVar14._8_8_;
        *(undefined8 *)(*local_27e0 + 0x10) = local_2a90;
        *(undefined8 *)(*local_27e0 + 0x18) = uStack_2a88;
        local_2ad0 = auVar16._0_8_;
        uStack_2ac8 = auVar16._8_8_;
        *(undefined8 *)local_27e0[1] = local_2ad0;
        *(undefined8 *)(local_27e0[1] + 8) = uStack_2ac8;
        local_2a60 = auVar19._0_8_;
        uStack_2a58 = auVar19._8_8_;
        *(undefined8 *)(local_27e0[1] + 0x10) = local_2a60;
        *(undefined8 *)(local_27e0[1] + 0x18) = uStack_2a58;
        local_2aa0 = auVar3._0_8_;
        uStack_2a98 = auVar3._8_8_;
        *(undefined8 *)local_27e0[2] = local_2aa0;
        *(undefined8 *)(local_27e0[2] + 8) = uStack_2a98;
        local_2ae0 = auVar4._0_8_;
        uStack_2ad8 = auVar4._8_8_;
        *(undefined8 *)(local_27e0[2] + 0x10) = local_2ae0;
        *(undefined8 *)(local_27e0[2] + 0x18) = uStack_2ad8;
        local_2a70 = auVar13._0_8_;
        uStack_2a68 = auVar13._8_8_;
        *(undefined8 *)local_27e0[3] = local_2a70;
        *(undefined8 *)(local_27e0[3] + 8) = uStack_2a68;
        local_2ab0 = auVar15._0_8_;
        uStack_2aa8 = auVar15._8_8_;
        *(undefined8 *)(local_27e0[3] + 0x10) = local_2ab0;
        *(undefined8 *)(local_27e0[3] + 0x18) = uStack_2aa8;
        local_2af0 = auVar22._0_8_;
        uStack_2ae8 = auVar22._8_8_;
        *(undefined8 *)local_27e0[4] = local_2af0;
        *(undefined8 *)(local_27e0[4] + 8) = uStack_2ae8;
        local_2a80 = auVar2._0_8_;
        uStack_2a78 = auVar2._8_8_;
        *(undefined8 *)(local_27e0[4] + 0x10) = local_2a80;
        *(undefined8 *)(local_27e0[4] + 0x18) = uStack_2a78;
        local_2ac0 = auVar20._0_8_;
        uStack_2ab8 = auVar20._8_8_;
        *(undefined8 *)local_27e0[5] = local_2ac0;
        *(undefined8 *)(local_27e0[5] + 8) = uStack_2ab8;
        *(undefined1 (*) [16])(local_27e0[5] + 0x10) = auVar21;
        local_27e0 = local_27e0 + 6;
        local_2848 = (undefined1 (*) [32])(*local_2848 + 0x10);
        local_2850 = (undefined1 (*) [32])(*local_2850 + 0x10);
        local_2858 = (undefined1 (*) [32])(*local_2858 + 0x10);
        local_2860 = (undefined1 (*) [32])(*local_2860 + 0x10);
        local_2868 = (undefined1 (*) [32])(*local_2868 + 0x10);
        local_2870 = (undefined1 (*) [32])(*local_2870 + 0x10);
        local_2878 = (undefined1 (*) [32])(*local_2878 + 0x10);
        local_2880 = (undefined1 (*) [32])(*local_2880 + 0x10);
        local_2888 = (undefined1 (*) [32])(*local_2888 + 0x10);
        local_2890 = (undefined1 (*) [32])(*local_2890 + 0x10);
        local_2898 = (undefined1 (*) [32])(*local_2898 + 0x10);
        local_28a0 = (undefined1 (*) [32])(*local_28a0 + 0x10);
      }
      for (; local_28a4 < in_R9D; local_28a4 = local_28a4 + 1) {
        *(undefined4 *)*local_27e0 = *(undefined4 *)*local_2848;
        *(undefined4 *)(*local_27e0 + 4) = *(undefined4 *)*local_2850;
        *(undefined4 *)(*local_27e0 + 8) = *(undefined4 *)*local_2858;
        *(undefined4 *)(*local_27e0 + 0xc) = *(undefined4 *)*local_2860;
        *(undefined4 *)(*local_27e0 + 0x10) = *(undefined4 *)*local_2868;
        *(undefined4 *)(*local_27e0 + 0x14) = *(undefined4 *)*local_2870;
        *(undefined4 *)(*local_27e0 + 0x18) = *(undefined4 *)*local_2878;
        *(undefined4 *)(*local_27e0 + 0x1c) = *(undefined4 *)*local_2880;
        *(undefined4 *)local_27e0[1] = *(undefined4 *)*local_2888;
        *(undefined4 *)(local_27e0[1] + 4) = *(undefined4 *)*local_2890;
        *(undefined4 *)(local_27e0[1] + 8) = *(undefined4 *)*local_2898;
        *(undefined4 *)(local_27e0[1] + 0xc) = *(undefined4 *)*local_28a0;
        local_27e0 = (undefined1 (*) [32])(local_27e0[1] + 0x10);
        local_2848 = (undefined1 (*) [32])(*local_2848 + 4);
        local_2850 = (undefined1 (*) [32])(*local_2850 + 4);
        local_2858 = (undefined1 (*) [32])(*local_2858 + 4);
        local_2860 = (undefined1 (*) [32])(*local_2860 + 4);
        local_2868 = (undefined1 (*) [32])(*local_2868 + 4);
        local_2870 = (undefined1 (*) [32])(*local_2870 + 4);
        local_2878 = (undefined1 (*) [32])(*local_2878 + 4);
        local_2880 = (undefined1 (*) [32])(*local_2880 + 4);
        local_2888 = (undefined1 (*) [32])(*local_2888 + 4);
        local_2890 = (undefined1 (*) [32])(*local_2890 + 4);
        local_2898 = (undefined1 (*) [32])(*local_2898 + 4);
        local_28a0 = (undefined1 (*) [32])(*local_28a0 + 4);
      }
    }
  }
  for (; local_27e4 + 7 < in_ECX; local_27e4 = local_27e4 + 8) {
    if (iVar1 == 0x10) {
      local_2bc8 = (undefined1 (*) [32])
                   (*in_RDI + (long)(((in_EDX + local_27e4) / 0x10) * 0x10 * local_3070) * 4 +
                   (long)(in_R8D << 4) * 4);
      local_2bd0 = (undefined1 (*) [16])
                   (*in_RDI + (long)((((in_EDX + local_27e4) / 0x10) * 0x10 + 0x10) * local_3070) *
                              4 + (long)(in_R8D << 4) * 4);
      if ((in_EDX + local_27e4) % 0x10 == 0) {
        for (local_2bd4 = 0; local_2bd4 < in_R9D; local_2bd4 = local_2bd4 + 1) {
          *local_27e0 = *local_2bc8;
          local_27e0 = local_27e0 + 1;
          local_2bc8 = local_2bc8 + 2;
        }
      }
      if ((in_EDX + local_27e4) % 0x10 == 4) {
        for (local_2bd8 = 0; local_2bd8 < in_R9D; local_2bd8 = local_2bd8 + 1) {
          *local_27e0 = *(undefined1 (*) [32])(*local_2bc8 + 0x10);
          local_27e0 = local_27e0 + 1;
          local_2bc8 = local_2bc8 + 2;
        }
      }
      if ((in_EDX + local_27e4) % 0x10 == 8) {
        for (local_2bdc = 0; local_2bdc < in_R9D; local_2bdc = local_2bdc + 1) {
          *local_27e0 = local_2bc8[1];
          local_27e0 = local_27e0 + 1;
          local_2bc8 = local_2bc8 + 2;
        }
      }
      if ((in_EDX + local_27e4) % 0x10 == 0xc) {
        for (local_2be0 = 0; local_2be0 < in_R9D; local_2be0 = local_2be0 + 1) {
          uVar29 = *(undefined8 *)(local_2bc8[1] + 0x18);
          *(undefined8 *)*local_27e0 = *(undefined8 *)(local_2bc8[1] + 0x10);
          *(undefined8 *)(*local_27e0 + 8) = uVar29;
          *(undefined1 (*) [16])(*local_27e0 + 0x10) = *local_2bd0;
          local_27e0 = local_27e0 + 1;
          local_2bc8 = local_2bc8 + 2;
          local_2bd0 = local_2bd0 + 4;
        }
      }
    }
    if (iVar1 == 8) {
      local_2be8 = (undefined1 (*) [32])
                   (*in_RDI + (long)(((in_EDX + local_27e4) / 8) * 8 * local_3070) * 4 +
                   (long)(in_R8D << 3) * 4);
      local_2bf0 = (undefined1 (*) [16])
                   (*in_RDI + (long)(((in_EDX + local_27e4 + 8) / 8) * 8 * local_3070) * 4 +
                   (long)(in_R8D << 3) * 4);
      if ((in_EDX + local_27e4) % 8 == 0) {
        for (local_2bf4 = 0; local_2bf4 < in_R9D; local_2bf4 = local_2bf4 + 1) {
          *local_27e0 = *local_2be8;
          local_27e0 = local_27e0 + 1;
          local_2be8 = local_2be8 + 1;
        }
      }
      if ((in_EDX + local_27e4) % 8 == 4) {
        for (local_2bf8 = 0; local_2bf8 < in_R9D; local_2bf8 = local_2bf8 + 1) {
          uVar29 = *(undefined8 *)(*local_2be8 + 0x18);
          *(undefined8 *)*local_27e0 = *(undefined8 *)(*local_2be8 + 0x10);
          *(undefined8 *)(*local_27e0 + 8) = uVar29;
          *(undefined1 (*) [16])(*local_27e0 + 0x10) = *local_2bf0;
          local_27e0 = local_27e0 + 1;
          local_2be8 = local_2be8 + 1;
          local_2bf0 = local_2bf0 + 2;
        }
      }
    }
    if (iVar1 == 4) {
      local_2c00 = (undefined8 *)
                   (*in_RDI + (long)((in_EDX + local_27e4) * local_3070) * 4 +
                   (long)(in_R8D << 2) * 4);
      local_2c08 = (undefined1 (*) [16])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 4) * local_3070) * 4 +
                   (long)(in_R8D << 2) * 4);
      for (local_2c0c = 0; local_2c0c < in_R9D; local_2c0c = local_2c0c + 1) {
        uVar29 = local_2c00[1];
        *(undefined8 *)*local_27e0 = *local_2c00;
        *(undefined8 *)(*local_27e0 + 8) = uVar29;
        *(undefined1 (*) [16])(*local_27e0 + 0x10) = *local_2c08;
        local_27e0 = local_27e0 + 1;
        local_2c00 = local_2c00 + 2;
        local_2c08 = local_2c08 + 1;
      }
    }
    if (iVar1 == 1) {
      local_2c18 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4) * local_3070) * 4 + (long)in_R8D * 4);
      local_2c20 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 1) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2c28 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 2) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2c30 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 3) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2c38 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 4) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2c40 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 5) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2c48 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 6) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2c50 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 7) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      for (local_2c54 = 0; local_2c54 + 7 < in_R9D; local_2c54 = local_2c54 + 8) {
        auVar23 = vunpcklps_avx(*local_2c18,*local_2c20);
        auVar6 = vunpckhps_avx(*local_2c18,*local_2c20);
        auVar11 = vunpcklps_avx(*local_2c28,*local_2c30);
        auVar7 = vunpckhps_avx(*local_2c28,*local_2c30);
        auVar24 = vunpcklps_avx(*local_2c38,*local_2c40);
        auVar8 = vunpckhps_avx(*local_2c38,*local_2c40);
        auVar18 = vunpcklps_avx(*local_2c48,*local_2c50);
        auVar9 = vunpckhps_avx(*local_2c48,*local_2c50);
        auVar10 = vunpcklpd_avx(auVar23,auVar11);
        auVar23 = vunpckhpd_avx(auVar23,auVar11);
        auVar11 = vunpcklpd_avx(auVar6,auVar7);
        auVar6 = vunpckhpd_avx(auVar6,auVar7);
        auVar17 = vunpcklpd_avx(auVar24,auVar18);
        auVar7 = vunpckhpd_avx(auVar24,auVar18);
        auVar24 = vunpcklpd_avx(auVar8,auVar9);
        auVar8 = vunpckhpd_avx(auVar8,auVar9);
        auVar9 = vperm2f128_avx(auVar10,auVar17,0x20);
        auVar18 = vperm2f128_avx(auVar23,auVar7,0x20);
        uStack_2c88 = auVar18._24_8_;
        uStack_2c90 = auVar18._16_8_;
        uStack_2c98 = auVar18._8_8_;
        local_2ca0 = auVar18._0_8_;
        auVar18 = vperm2f128_avx(auVar11,auVar24,0x20);
        uStack_2ca8 = auVar18._24_8_;
        uStack_2cb0 = auVar18._16_8_;
        uStack_2cb8 = auVar18._8_8_;
        local_2cc0 = auVar18._0_8_;
        auVar18 = vperm2f128_avx(auVar6,auVar8,0x20);
        uStack_2cc8 = auVar18._24_8_;
        uStack_2cd0 = auVar18._16_8_;
        uStack_2cd8 = auVar18._8_8_;
        local_2ce0 = auVar18._0_8_;
        auVar10 = vperm2f128_avx(auVar10,auVar17,0x31);
        uStack_2ce8 = auVar10._24_8_;
        uStack_2cf0 = auVar10._16_8_;
        uStack_2cf8 = auVar10._8_8_;
        local_2d00 = auVar10._0_8_;
        auVar23 = vperm2f128_avx(auVar23,auVar7,0x31);
        uStack_2d08 = auVar23._24_8_;
        uStack_2d10 = auVar23._16_8_;
        uStack_2d18 = auVar23._8_8_;
        local_2d20 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar11,auVar24,0x31);
        uStack_2d28 = auVar23._24_8_;
        uStack_2d30 = auVar23._16_8_;
        uStack_2d38 = auVar23._8_8_;
        local_2d40 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar6,auVar8,0x31);
        uStack_2c68 = auVar9._24_8_;
        uStack_2c70 = auVar9._16_8_;
        uStack_2c78 = auVar9._8_8_;
        local_2c80 = auVar9._0_8_;
        *(undefined8 *)*local_27e0 = local_2c80;
        *(undefined8 *)(*local_27e0 + 8) = uStack_2c78;
        *(undefined8 *)(*local_27e0 + 0x10) = uStack_2c70;
        *(undefined8 *)(*local_27e0 + 0x18) = uStack_2c68;
        *(undefined8 *)local_27e0[1] = local_2ca0;
        *(undefined8 *)(local_27e0[1] + 8) = uStack_2c98;
        *(undefined8 *)(local_27e0[1] + 0x10) = uStack_2c90;
        *(undefined8 *)(local_27e0[1] + 0x18) = uStack_2c88;
        *(undefined8 *)local_27e0[2] = local_2cc0;
        *(undefined8 *)(local_27e0[2] + 8) = uStack_2cb8;
        *(undefined8 *)(local_27e0[2] + 0x10) = uStack_2cb0;
        *(undefined8 *)(local_27e0[2] + 0x18) = uStack_2ca8;
        *(undefined8 *)local_27e0[3] = local_2ce0;
        *(undefined8 *)(local_27e0[3] + 8) = uStack_2cd8;
        *(undefined8 *)(local_27e0[3] + 0x10) = uStack_2cd0;
        *(undefined8 *)(local_27e0[3] + 0x18) = uStack_2cc8;
        *(undefined8 *)local_27e0[4] = local_2d00;
        *(undefined8 *)(local_27e0[4] + 8) = uStack_2cf8;
        *(undefined8 *)(local_27e0[4] + 0x10) = uStack_2cf0;
        *(undefined8 *)(local_27e0[4] + 0x18) = uStack_2ce8;
        *(undefined8 *)local_27e0[5] = local_2d20;
        *(undefined8 *)(local_27e0[5] + 8) = uStack_2d18;
        *(undefined8 *)(local_27e0[5] + 0x10) = uStack_2d10;
        *(undefined8 *)(local_27e0[5] + 0x18) = uStack_2d08;
        *(undefined8 *)local_27e0[6] = local_2d40;
        *(undefined8 *)(local_27e0[6] + 8) = uStack_2d38;
        *(undefined8 *)(local_27e0[6] + 0x10) = uStack_2d30;
        *(undefined8 *)(local_27e0[6] + 0x18) = uStack_2d28;
        local_27e0[7] = auVar23;
        local_27e0 = local_27e0 + 8;
        local_2c18 = local_2c18 + 1;
        local_2c20 = local_2c20 + 1;
        local_2c28 = local_2c28 + 1;
        local_2c30 = local_2c30 + 1;
        local_2c38 = local_2c38 + 1;
        local_2c40 = local_2c40 + 1;
        local_2c48 = local_2c48 + 1;
        local_2c50 = local_2c50 + 1;
      }
      for (; local_2c54 + 3 < in_R9D; local_2c54 = local_2c54 + 4) {
        auVar19 = vunpcklps_avx(*(undefined1 (*) [16])*local_2c18,*(undefined1 (*) [16])*local_2c20)
        ;
        auVar20 = vunpcklps_avx(*(undefined1 (*) [16])*local_2c28,*(undefined1 (*) [16])*local_2c30)
        ;
        auVar2 = vunpckhps_avx(*(undefined1 (*) [16])*local_2c18,*(undefined1 (*) [16])*local_2c20);
        auVar3 = vunpckhps_avx(*(undefined1 (*) [16])*local_2c28,*(undefined1 (*) [16])*local_2c30);
        auVar21 = vunpcklpd_avx(auVar19,auVar20);
        auVar19 = vunpckhpd_avx(auVar19,auVar20);
        auVar5 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        auVar3 = vunpcklps_avx(*(undefined1 (*) [16])*local_2c38,*(undefined1 (*) [16])*local_2c40);
        auVar13 = vunpcklps_avx(*(undefined1 (*) [16])*local_2c48,*(undefined1 (*) [16])*local_2c50)
        ;
        auVar20 = vunpckhps_avx(*(undefined1 (*) [16])*local_2c38,*(undefined1 (*) [16])*local_2c40)
        ;
        auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*local_2c48,*(undefined1 (*) [16])*local_2c50);
        auVar12 = vunpcklpd_avx(auVar3,auVar13);
        auVar3 = vunpckhpd_avx(auVar3,auVar13);
        auVar13 = vunpcklpd_avx(auVar20,auVar4);
        auVar20 = vunpckhpd_avx(auVar20,auVar4);
        local_2d70 = auVar21._0_8_;
        uStack_2d68 = auVar21._8_8_;
        *(undefined8 *)*local_27e0 = local_2d70;
        *(undefined8 *)(*local_27e0 + 8) = uStack_2d68;
        local_2db0 = auVar12._0_8_;
        uStack_2da8 = auVar12._8_8_;
        *(undefined8 *)(*local_27e0 + 0x10) = local_2db0;
        *(undefined8 *)(*local_27e0 + 0x18) = uStack_2da8;
        local_2d80 = auVar19._0_8_;
        uStack_2d78 = auVar19._8_8_;
        *(undefined8 *)local_27e0[1] = local_2d80;
        *(undefined8 *)(local_27e0[1] + 8) = uStack_2d78;
        local_2dc0 = auVar3._0_8_;
        uStack_2db8 = auVar3._8_8_;
        *(undefined8 *)(local_27e0[1] + 0x10) = local_2dc0;
        *(undefined8 *)(local_27e0[1] + 0x18) = uStack_2db8;
        local_2d90 = auVar5._0_8_;
        uStack_2d88 = auVar5._8_8_;
        *(undefined8 *)local_27e0[2] = local_2d90;
        *(undefined8 *)(local_27e0[2] + 8) = uStack_2d88;
        local_2dd0 = auVar13._0_8_;
        uStack_2dc8 = auVar13._8_8_;
        *(undefined8 *)(local_27e0[2] + 0x10) = local_2dd0;
        *(undefined8 *)(local_27e0[2] + 0x18) = uStack_2dc8;
        local_2da0 = auVar2._0_8_;
        uStack_2d98 = auVar2._8_8_;
        *(undefined8 *)local_27e0[3] = local_2da0;
        *(undefined8 *)(local_27e0[3] + 8) = uStack_2d98;
        *(undefined1 (*) [16])(local_27e0[3] + 0x10) = auVar20;
        local_27e0 = local_27e0 + 4;
        local_2c18 = (undefined1 (*) [32])(*local_2c18 + 0x10);
        local_2c20 = (undefined1 (*) [32])(*local_2c20 + 0x10);
        local_2c28 = (undefined1 (*) [32])(*local_2c28 + 0x10);
        local_2c30 = (undefined1 (*) [32])(*local_2c30 + 0x10);
        local_2c38 = (undefined1 (*) [32])(*local_2c38 + 0x10);
        local_2c40 = (undefined1 (*) [32])(*local_2c40 + 0x10);
        local_2c48 = (undefined1 (*) [32])(*local_2c48 + 0x10);
        local_2c50 = (undefined1 (*) [32])(*local_2c50 + 0x10);
      }
      for (; local_2c54 < in_R9D; local_2c54 = local_2c54 + 1) {
        *(undefined4 *)*local_27e0 = *(undefined4 *)*local_2c18;
        *(undefined4 *)(*local_27e0 + 4) = *(undefined4 *)*local_2c20;
        *(undefined4 *)(*local_27e0 + 8) = *(undefined4 *)*local_2c28;
        *(undefined4 *)(*local_27e0 + 0xc) = *(undefined4 *)*local_2c30;
        *(undefined4 *)(*local_27e0 + 0x10) = *(undefined4 *)*local_2c38;
        *(undefined4 *)(*local_27e0 + 0x14) = *(undefined4 *)*local_2c40;
        *(undefined4 *)(*local_27e0 + 0x18) = *(undefined4 *)*local_2c48;
        *(undefined4 *)(*local_27e0 + 0x1c) = *(undefined4 *)*local_2c50;
        local_27e0 = local_27e0 + 1;
        local_2c18 = (undefined1 (*) [32])(*local_2c18 + 4);
        local_2c20 = (undefined1 (*) [32])(*local_2c20 + 4);
        local_2c28 = (undefined1 (*) [32])(*local_2c28 + 4);
        local_2c30 = (undefined1 (*) [32])(*local_2c30 + 4);
        local_2c38 = (undefined1 (*) [32])(*local_2c38 + 4);
        local_2c40 = (undefined1 (*) [32])(*local_2c40 + 4);
        local_2c48 = (undefined1 (*) [32])(*local_2c48 + 4);
        local_2c50 = (undefined1 (*) [32])(*local_2c50 + 4);
      }
    }
  }
  for (; local_27e4 + 3 < in_ECX; local_27e4 = local_27e4 + 4) {
    if (iVar1 == 0x10) {
      local_2e68 = (undefined1 (*) [16])
                   (*in_RDI + (long)(((in_EDX + local_27e4) / 0x10) * 0x10 * local_3070) * 4 +
                   (long)(in_R8D << 4) * 4);
      if ((in_EDX + local_27e4) % 0x10 == 0) {
        for (local_2e6c = 0; local_2e6c < in_R9D; local_2e6c = local_2e6c + 1) {
          *(undefined1 (*) [16])*local_27e0 = *local_2e68;
          local_27e0 = (undefined1 (*) [32])(*local_27e0 + 0x10);
          local_2e68 = local_2e68 + 4;
        }
      }
      if ((in_EDX + local_27e4) % 0x10 == 4) {
        for (local_2e70 = 0; local_2e70 < in_R9D; local_2e70 = local_2e70 + 1) {
          *(undefined1 (*) [16])*local_27e0 = local_2e68[1];
          local_27e0 = (undefined1 (*) [32])(*local_27e0 + 0x10);
          local_2e68 = local_2e68 + 4;
        }
      }
      if ((in_EDX + local_27e4) % 0x10 == 8) {
        for (local_2e74 = 0; local_2e74 < in_R9D; local_2e74 = local_2e74 + 1) {
          *(undefined1 (*) [16])*local_27e0 = local_2e68[2];
          local_27e0 = (undefined1 (*) [32])(*local_27e0 + 0x10);
          local_2e68 = local_2e68 + 4;
        }
      }
      if ((in_EDX + local_27e4) % 0x10 == 0xc) {
        for (local_2e78 = 0; local_2e78 < in_R9D; local_2e78 = local_2e78 + 1) {
          *(undefined1 (*) [16])*local_27e0 = local_2e68[3];
          local_27e0 = (undefined1 (*) [32])(*local_27e0 + 0x10);
          local_2e68 = local_2e68 + 4;
        }
      }
    }
    if (iVar1 == 8) {
      local_2e80 = (undefined1 (*) [16])
                   (*in_RDI + (long)(((in_EDX + local_27e4) / 8) * 8 * local_3070) * 4 +
                   (long)(in_R8D << 3) * 4);
      if ((in_EDX + local_27e4) % 8 == 0) {
        for (local_2e84 = 0; local_2e84 < in_R9D; local_2e84 = local_2e84 + 1) {
          *(undefined1 (*) [16])*local_27e0 = *local_2e80;
          local_27e0 = (undefined1 (*) [32])(*local_27e0 + 0x10);
          local_2e80 = local_2e80 + 2;
        }
      }
      if ((in_EDX + local_27e4) % 8 == 4) {
        for (local_2e88 = 0; local_2e88 < in_R9D; local_2e88 = local_2e88 + 1) {
          *(undefined1 (*) [16])*local_27e0 = local_2e80[1];
          local_27e0 = (undefined1 (*) [32])(*local_27e0 + 0x10);
          local_2e80 = local_2e80 + 2;
        }
      }
    }
    if (iVar1 == 4) {
      local_2e90 = (undefined1 (*) [16])
                   (*in_RDI + (long)((in_EDX + local_27e4) * local_3070) * 4 +
                   (long)(in_R8D << 2) * 4);
      for (local_2e94 = 0; local_2e94 < in_R9D; local_2e94 = local_2e94 + 1) {
        *(undefined1 (*) [16])*local_27e0 = *local_2e90;
        local_27e0 = (undefined1 (*) [32])(*local_27e0 + 0x10);
        local_2e90 = local_2e90 + 1;
      }
    }
    if (iVar1 == 1) {
      local_2ea0 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4) * local_3070) * 4 + (long)in_R8D * 4);
      local_2ea8 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 1) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2eb0 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 2) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      local_2eb8 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_27e4 + 3) * local_3070) * 4 + (long)in_R8D * 4)
      ;
      for (local_2ebc = 0; local_2ebc + 7 < in_R9D; local_2ebc = local_2ebc + 8) {
        auVar23 = vunpcklps_avx(*local_2ea0,*local_2ea8);
        auVar6 = vunpckhps_avx(*local_2ea0,*local_2ea8);
        auVar9 = vunpcklps_avx(*local_2eb0,*local_2eb8);
        auVar7 = vunpckhps_avx(*local_2eb0,*local_2eb8);
        auVar8 = vunpcklpd_avx(auVar23,auVar9);
        auVar23 = vunpckhpd_avx(auVar23,auVar9);
        auVar9 = vunpcklpd_avx(auVar6,auVar7);
        auVar6 = vunpckhpd_avx(auVar6,auVar7);
        auVar7 = vperm2f128_avx(auVar8,auVar23,0x20);
        auVar10 = vperm2f128_avx(auVar9,auVar6,0x20);
        uStack_2ee8 = auVar10._24_8_;
        uStack_2ef0 = auVar10._16_8_;
        uStack_2ef8 = auVar10._8_8_;
        local_2f00 = auVar10._0_8_;
        auVar23 = vperm2f128_avx(auVar8,auVar23,0x31);
        uStack_2f08 = auVar23._24_8_;
        uStack_2f10 = auVar23._16_8_;
        uStack_2f18 = auVar23._8_8_;
        local_2f20 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar9,auVar6,0x31);
        uStack_2ec8 = auVar7._24_8_;
        uStack_2ed0 = auVar7._16_8_;
        uStack_2ed8 = auVar7._8_8_;
        local_2ee0 = auVar7._0_8_;
        *(undefined8 *)*local_27e0 = local_2ee0;
        *(undefined8 *)(*local_27e0 + 8) = uStack_2ed8;
        *(undefined8 *)(*local_27e0 + 0x10) = uStack_2ed0;
        *(undefined8 *)(*local_27e0 + 0x18) = uStack_2ec8;
        *(undefined8 *)local_27e0[1] = local_2f00;
        *(undefined8 *)(local_27e0[1] + 8) = uStack_2ef8;
        *(undefined8 *)(local_27e0[1] + 0x10) = uStack_2ef0;
        *(undefined8 *)(local_27e0[1] + 0x18) = uStack_2ee8;
        *(undefined8 *)local_27e0[2] = local_2f20;
        *(undefined8 *)(local_27e0[2] + 8) = uStack_2f18;
        *(undefined8 *)(local_27e0[2] + 0x10) = uStack_2f10;
        *(undefined8 *)(local_27e0[2] + 0x18) = uStack_2f08;
        local_27e0[3] = auVar23;
        local_27e0 = local_27e0 + 4;
        local_2ea0 = local_2ea0 + 1;
        local_2ea8 = local_2ea8 + 1;
        local_2eb0 = local_2eb0 + 1;
        local_2eb8 = local_2eb8 + 1;
      }
      for (; local_2ebc + 3 < in_R9D; local_2ebc = local_2ebc + 4) {
        auVar19 = vunpcklps_avx(*(undefined1 (*) [16])*local_2ea0,*(undefined1 (*) [16])*local_2ea8)
        ;
        auVar4 = vunpcklps_avx(*(undefined1 (*) [16])*local_2eb0,*(undefined1 (*) [16])*local_2eb8);
        auVar2 = vunpckhps_avx(*(undefined1 (*) [16])*local_2ea0,*(undefined1 (*) [16])*local_2ea8);
        auVar3 = vunpckhps_avx(*(undefined1 (*) [16])*local_2eb0,*(undefined1 (*) [16])*local_2eb8);
        auVar20 = vunpcklpd_avx(auVar19,auVar4);
        auVar19 = vunpckhpd_avx(auVar19,auVar4);
        auVar4 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        local_2f50 = auVar20._0_8_;
        uStack_2f48 = auVar20._8_8_;
        *(undefined8 *)*local_27e0 = local_2f50;
        *(undefined8 *)(*local_27e0 + 8) = uStack_2f48;
        local_2f60 = auVar19._0_8_;
        uStack_2f58 = auVar19._8_8_;
        *(undefined8 *)(*local_27e0 + 0x10) = local_2f60;
        *(undefined8 *)(*local_27e0 + 0x18) = uStack_2f58;
        local_2f70 = auVar4._0_8_;
        uStack_2f68 = auVar4._8_8_;
        *(undefined8 *)local_27e0[1] = local_2f70;
        *(undefined8 *)(local_27e0[1] + 8) = uStack_2f68;
        *(undefined1 (*) [16])(local_27e0[1] + 0x10) = auVar2;
        local_27e0 = local_27e0 + 2;
        local_2ea0 = (undefined1 (*) [32])(*local_2ea0 + 0x10);
        local_2ea8 = (undefined1 (*) [32])(*local_2ea8 + 0x10);
        local_2eb0 = (undefined1 (*) [32])(*local_2eb0 + 0x10);
        local_2eb8 = (undefined1 (*) [32])(*local_2eb8 + 0x10);
      }
      for (; local_2ebc < in_R9D; local_2ebc = local_2ebc + 1) {
        *(undefined4 *)*local_27e0 = *(undefined4 *)*local_2ea0;
        *(undefined4 *)(*local_27e0 + 4) = *(undefined4 *)*local_2ea8;
        *(undefined4 *)(*local_27e0 + 8) = *(undefined4 *)*local_2eb0;
        *(undefined4 *)(*local_27e0 + 0xc) = *(undefined4 *)*local_2eb8;
        local_27e0 = (undefined1 (*) [32])(*local_27e0 + 0x10);
        local_2ea0 = (undefined1 (*) [32])(*local_2ea0 + 4);
        local_2ea8 = (undefined1 (*) [32])(*local_2ea8 + 4);
        local_2eb0 = (undefined1 (*) [32])(*local_2eb0 + 4);
        local_2eb8 = (undefined1 (*) [32])(*local_2eb8 + 4);
      }
    }
  }
  for (; local_27e4 + 1 < in_ECX; local_27e4 = local_27e4 + 2) {
    local_2fc8 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_27e4) * local_3070) * 4 + (long)in_R8D * 4);
    local_2fd0 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_27e4 + 1) * local_3070) * 4 + (long)in_R8D * 4);
    for (local_2fd4 = 0; local_2fd4 + 7 < in_R9D; local_2fd4 = local_2fd4 + 8) {
      auVar6 = vunpcklps_avx(*local_2fc8,*local_2fd0);
      auVar23 = vunpckhps_avx(*local_2fc8,*local_2fd0);
      auVar7 = vperm2f128_avx(auVar6,auVar23,0x20);
      auVar23 = vperm2f128_avx(auVar6,auVar23,0x31);
      uStack_2fe8 = auVar7._24_8_;
      uStack_2ff0 = auVar7._16_8_;
      uStack_2ff8 = auVar7._8_8_;
      local_3000 = auVar7._0_8_;
      *(undefined8 *)*local_27e0 = local_3000;
      *(undefined8 *)(*local_27e0 + 8) = uStack_2ff8;
      *(undefined8 *)(*local_27e0 + 0x10) = uStack_2ff0;
      *(undefined8 *)(*local_27e0 + 0x18) = uStack_2fe8;
      local_27e0[1] = auVar23;
      local_27e0 = local_27e0 + 2;
      local_2fc8 = local_2fc8 + 1;
      local_2fd0 = local_2fd0 + 1;
    }
    for (; local_2fd4 + 3 < in_R9D; local_2fd4 = local_2fd4 + 4) {
      auVar2 = vunpcklps_avx(*(undefined1 (*) [16])*local_2fc8,*(undefined1 (*) [16])*local_2fd0);
      auVar19 = vunpckhps_avx(*(undefined1 (*) [16])*local_2fc8,*(undefined1 (*) [16])*local_2fd0);
      local_3050 = auVar2._0_8_;
      uStack_3048 = auVar2._8_8_;
      *(undefined8 *)*local_27e0 = local_3050;
      *(undefined8 *)(*local_27e0 + 8) = uStack_3048;
      *(undefined1 (*) [16])(*local_27e0 + 0x10) = auVar19;
      local_27e0 = local_27e0 + 1;
      local_2fc8 = (undefined1 (*) [32])(*local_2fc8 + 0x10);
      local_2fd0 = (undefined1 (*) [32])(*local_2fd0 + 0x10);
    }
    for (; local_2fd4 < in_R9D; local_2fd4 = local_2fd4 + 1) {
      *(undefined4 *)*local_27e0 = *(undefined4 *)*local_2fc8;
      *(undefined4 *)(*local_27e0 + 4) = *(undefined4 *)*local_2fd0;
      local_27e0 = (undefined1 (*) [32])(*local_27e0 + 8);
      local_2fc8 = (undefined1 (*) [32])(*local_2fc8 + 4);
      local_2fd0 = (undefined1 (*) [32])(*local_2fd0 + 4);
    }
  }
  for (; local_27e4 < in_ECX; local_27e4 = local_27e4 + 1) {
    local_3068 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_27e4) * local_3070) * 4 + (long)in_R8D * 4);
    for (local_306c = 0; local_306c + 7 < in_R9D; local_306c = local_306c + 8) {
      *local_27e0 = *local_3068;
      local_27e0 = local_27e0 + 1;
      local_3068 = local_3068 + 1;
    }
    for (; local_306c + 3 < in_R9D; local_306c = local_306c + 4) {
      *(undefined1 (*) [16])*local_27e0 = *(undefined1 (*) [16])*local_3068;
      local_27e0 = (undefined1 (*) [32])(*local_27e0 + 0x10);
      local_3068 = (undefined1 (*) [32])(*local_3068 + 0x10);
    }
    for (; local_306c < in_R9D; local_306c = local_306c + 1) {
      *(undefined4 *)*local_27e0 = *(undefined4 *)*local_3068;
      local_27e0 = (undefined1 (*) [32])(*local_27e0 + 4);
      local_3068 = (undefined1 (*) [32])(*local_3068 + 4);
    }
  }
  return;
}

Assistant:

static void pack_B_tile(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    const int elempack = B.elempack;
    const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

    float* pp = BT;

    int jj = 0;
#if __SSE2__
    for (; jj + 11 < max_jj; jj += 12)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;
            const float* p1 = (const float*)B + ((j + jj) / 16 * 16 + 16) * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    _mm_store_ps(pp + 8, _mm_load_ps(p0 + 8));
                    pp += 12;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_loadu_ps(p0 + 4));
                    _mm_store_ps(pp + 8, _mm_load_ps(p0 + 12));
                    pp += 12;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0 + 8));
                    _mm_store_ps(pp + 8, _mm_load_ps(p1));
                    pp += 12;
                    p0 += 16;
                    p1 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    _mm256_storeu_ps(pp + 4, _mm256_load_ps(p1));
                    pp += 12;
                    p0 += 16;
                    p1 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;
            const float* p1 = (const float*)B + ((j + jj) / 8 * 8 + 8) * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    _mm_store_ps(pp + 8, _mm_load_ps(p1));
                    pp += 12;
                    p0 += 8;
                    p1 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    _mm256_storeu_ps(pp + 4, _mm256_load_ps(p1));
                    pp += 12;
                    p0 += 8;
                    p1 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;
            const float* p1 = (const float*)B + (j + jj + 4) * B_hstep + k * 4;
            const float* p2 = (const float*)B + (j + jj + 8) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                _mm_store_ps(pp + 8, _mm_load_ps(p2));
                pp += 12;
                p0 += 4;
                p1 += 4;
                p2 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;
            const float* p4 = (const float*)B + (j + jj + 4) * B_hstep + k;
            const float* p5 = (const float*)B + (j + jj + 5) * B_hstep + k;
            const float* p6 = (const float*)B + (j + jj + 6) * B_hstep + k;
            const float* p7 = (const float*)B + (j + jj + 7) * B_hstep + k;
            const float* p8 = (const float*)B + (j + jj + 8) * B_hstep + k;
            const float* p9 = (const float*)B + (j + jj + 9) * B_hstep + k;
            const float* pa = (const float*)B + (j + jj + 10) * B_hstep + k;
            const float* pb = (const float*)B + (j + jj + 11) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                __m256 _r8 = _mm256_loadu_ps(p8);
                __m256 _r9 = _mm256_loadu_ps(p9);
                __m256 _ra = _mm256_loadu_ps(pa);
                __m256 _rb = _mm256_loadu_ps(pb);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                _mm256_storeu_ps(pp + 8 * 4, _r4);
                _mm256_storeu_ps(pp + 8 * 5, _r5);
                _mm256_storeu_ps(pp + 8 * 6, _r6);
                _mm256_storeu_ps(pp + 8 * 7, _r7);
                _mm256_storeu_ps(pp + 8 * 8, _r8);
                _mm256_storeu_ps(pp + 8 * 9, _r9);
                _mm256_storeu_ps(pp + 8 * 10, _ra);
                _mm256_storeu_ps(pp + 8 * 11, _rb);
                pp += 96;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
                p8 += 8;
                p9 += 8;
                pa += 8;
                pb += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                __m128 _r4 = _mm_loadu_ps(p4);
                __m128 _r5 = _mm_loadu_ps(p5);
                __m128 _r6 = _mm_loadu_ps(p6);
                __m128 _r7 = _mm_loadu_ps(p7);
                __m128 _r8 = _mm_loadu_ps(p8);
                __m128 _r9 = _mm_loadu_ps(p9);
                __m128 _ra = _mm_loadu_ps(pa);
                __m128 _rb = _mm_loadu_ps(pb);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _r1);
                _mm_store_ps(pp + 4 * 4, _r5);
                _mm_store_ps(pp + 4 * 5, _r9);
                _mm_store_ps(pp + 4 * 6, _r2);
                _mm_store_ps(pp + 4 * 7, _r6);
                _mm_store_ps(pp + 4 * 8, _ra);
                _mm_store_ps(pp + 4 * 9, _r3);
                _mm_store_ps(pp + 4 * 10, _r7);
                _mm_store_ps(pp + 4 * 11, _rb);
                pp += 48;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
                p4 += 4;
                p5 += 4;
                p6 += 4;
                p7 += 4;
                p8 += 4;
                p9 += 4;
                pa += 4;
                pb += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp[8] = p8[0];
                pp[9] = p9[0];
                pp[10] = pa[0];
                pp[11] = pb[0];
                pp += 12;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
                p8++;
                p9++;
                pa++;
                pb++;
            }
        }
    }
    for (; jj + 7 < max_jj; jj += 8)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;
            const float* p1 = (const float*)B + ((j + jj) / 16 * 16 + 16) * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_loadu_ps(p0 + 4));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0 + 8));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    _mm_store_ps(pp + 4, _mm_load_ps(p1));
                    pp += 8;
                    p0 += 16;
                    p1 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;
            const float* p1 = (const float*)B + (j + jj + 8) / 8 * 8 * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    pp += 8;
                    p0 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    _mm_store_ps(pp + 4, _mm_load_ps(p1));
                    pp += 8;
                    p0 += 8;
                    p1 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;
            const float* p1 = (const float*)B + (j + jj + 4) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;
            const float* p4 = (const float*)B + (j + jj + 4) * B_hstep + k;
            const float* p5 = (const float*)B + (j + jj + 5) * B_hstep + k;
            const float* p6 = (const float*)B + (j + jj + 6) * B_hstep + k;
            const float* p7 = (const float*)B + (j + jj + 7) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                _mm256_storeu_ps(pp + 8 * 4, _r4);
                _mm256_storeu_ps(pp + 8 * 5, _r5);
                _mm256_storeu_ps(pp + 8 * 6, _r6);
                _mm256_storeu_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                __m128 _r4 = _mm_loadu_ps(p4);
                __m128 _r5 = _mm_loadu_ps(p5);
                __m128 _r6 = _mm_loadu_ps(p6);
                __m128 _r7 = _mm_loadu_ps(p7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
                p4 += 4;
                p5 += 4;
                p6 += 4;
                p7 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp += 8;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
            }
        }
    }
    for (; jj + 3 < max_jj; jj += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 8));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    pp += 4;
                    p0 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0));
                    pp += 4;
                    p0 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    pp += 4;
                    p0 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 16, _r2);
                _mm256_storeu_ps(pp + 24, _r3);
                pp += 32;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r1);
                _mm_store_ps(pp + 8, _r2);
                _mm_store_ps(pp + 12, _r3);
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp += 4;
                p0++;
                p1++;
                p2++;
                p3++;
            }
        }
    }
#endif // __SSE2__
    for (; jj + 1 < max_jj; jj += 2)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                transpose8x2_ps(_r0, _r1);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp += 2;
                p0++;
                p1++;
            }
        }
    }
    for (; jj < max_jj; jj += 1)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_storeu_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_storeu_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0++;
            }
        }
    }
}